

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcDecrypt.c
# Opt level: O3

void decryptInPlace(ThreefishKey_t *key,uint64_t *chain,uint64_t *plain_text,uint64_t num_blocks)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  u64b_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  uint64_t uVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  uint64_t uVar31;
  uint64_t uVar32;
  uint64_t uVar33;
  uint64_t uVar34;
  ulong *puVar35;
  ulong *extraout_RDX;
  ulong uVar36;
  uint64_t uVar37;
  ulong uVar38;
  uint64_t *puVar39;
  ulong uStack_1c8;
  ulong uStack_1c0;
  uint64_t uStack_1b8;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  uint uStack_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  
  uVar5 = key->stateSize;
  if (uVar5 == 0x400) {
    if (num_blocks << 4 != 0) {
      uStack_128 = 0;
      uStack_120 = 0;
      uVar38 = 0;
      uVar34 = 0;
      uStack_1c8 = 0;
      uStack_1b8 = 0;
      uStack_1c0 = 0;
      uStack_138 = 0;
      uStack_130 = 0;
      uStack_148 = 0;
      uStack_140 = 0;
      uStack_158 = 0;
      uStack_150 = 0;
      uStack_168 = 0;
      uStack_160 = 0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_188 = 0;
      uStack_180 = 0;
      uStack_b8._0_4_ = 0;
      uStack_b8._4_4_ = 0;
      uStack_b0._0_4_ = 0;
      uStack_b0._4_4_ = 0;
      uStack_d8 = 0;
      uStack_d4 = 0;
      uStack_d0 = 0;
      uStack_cc = 0;
      uStack_c8._0_4_ = 0;
      uStack_c8._4_4_ = 0;
      uStack_c0._0_4_ = 0;
      uStack_c0._4_4_ = 0;
      uStack_e8 = 0;
      uStack_e4 = 0;
      uStack_e0 = 0;
      uStack_dc = 0;
      uStack_f8._0_4_ = 0;
      uStack_f8._4_4_ = 0;
      uStack_f0._0_4_ = 0;
      uStack_f0._4_4_ = 0;
      uStack_108 = 0;
      uStack_104 = 0;
      uStack_100._0_4_ = 0;
      uStack_100._4_4_ = 0;
      uStack_118 = 0;
      uStack_114 = 0;
      uStack_110 = 0;
      uStack_10c = 0;
      puVar39 = plain_text;
      do {
        uVar18 = plain_text[uVar38];
        uVar19 = (plain_text + uVar38)[1];
        uVar20 = plain_text[uVar38 + 2];
        uVar26 = (plain_text + uVar38 + 2)[1];
        uVar27 = plain_text[uVar38 + 4];
        uVar14 = (plain_text + uVar38 + 4)[1];
        uVar21 = plain_text[uVar38 + 6];
        uVar22 = (plain_text + uVar38 + 6)[1];
        uVar23 = plain_text[uVar38 + 8];
        uVar24 = (plain_text + uVar38 + 8)[1];
        uVar25 = plain_text[uVar38 + 10];
        uVar15 = (plain_text + uVar38 + 10)[1];
        uVar16 = plain_text[uVar38 + 0xc];
        uVar17 = (plain_text + uVar38 + 0xc)[1];
        uVar3 = plain_text[uVar38 + 0xe];
        puVar35 = puVar39 + 0xf;
        uVar4 = plain_text[uVar38 + 0xf];
        threefishDecryptBlockWords(key,puVar39,puVar39);
        if ((uVar38 & 0x10) == 0) {
          uStack_118 = (uint)uVar16;
          uStack_114 = (uint)(uVar16 >> 0x20);
          uStack_110 = (uint)uVar17;
          uStack_10c = (uint)(uVar17 >> 0x20);
          uStack_108 = (uint)uVar25;
          uStack_104 = (uint)(uVar25 >> 0x20);
          uStack_100._0_4_ = (uint)uVar15;
          uStack_100._4_4_ = (uint)(uVar15 >> 0x20);
          uStack_f8._0_4_ = (uint)uVar23;
          uStack_f8._4_4_ = (uint)(uVar23 >> 0x20);
          uStack_f0._0_4_ = (uint)uVar24;
          uStack_f0._4_4_ = (uint)(uVar24 >> 0x20);
          uStack_e8 = (uint)uVar21;
          uStack_e4 = (uint)(uVar21 >> 0x20);
          uStack_e0 = (uint)uVar22;
          uStack_dc = (uint)(uVar22 >> 0x20);
          uStack_c8._0_4_ = (uint)uVar27;
          uStack_c8._4_4_ = (uint)(uVar27 >> 0x20);
          uStack_c0._0_4_ = (uint)uVar14;
          uStack_c0._4_4_ = (uint)(uVar14 >> 0x20);
          uStack_d8 = (uint)uVar20;
          uStack_d4 = (uint)(uVar20 >> 0x20);
          uStack_d0 = (uint)uVar26;
          uStack_cc = (uint)(uVar26 >> 0x20);
          uStack_b8._0_4_ = (uint)uVar18;
          uStack_b8._4_4_ = (uint)(uVar18 >> 0x20);
          uStack_b0._0_4_ = (uint)uVar19;
          uStack_b0._4_4_ = (uint)(uVar19 >> 0x20);
          uVar34 = uVar4;
          uStack_1c8 = uVar3;
          if (uVar38 == 0) {
            *plain_text = *plain_text ^ *chain;
            plain_text[1] = plain_text[1] ^ chain[1];
            plain_text[2] = plain_text[2] ^ chain[2];
            plain_text[3] = plain_text[3] ^ chain[3];
            plain_text[4] = plain_text[4] ^ chain[4];
            plain_text[5] = plain_text[5] ^ chain[5];
            plain_text[6] = plain_text[6] ^ chain[6];
            plain_text[7] = plain_text[7] ^ chain[7];
            plain_text[8] = plain_text[8] ^ chain[8];
            plain_text[9] = plain_text[9] ^ chain[9];
            plain_text[10] = plain_text[10] ^ chain[10];
            plain_text[0xb] = plain_text[0xb] ^ chain[0xb];
            plain_text[0xc] = plain_text[0xc] ^ chain[0xc];
            plain_text[0xd] = plain_text[0xd] ^ chain[0xd];
            plain_text[0xe] = plain_text[0xe] ^ chain[0xe];
            puVar35 = plain_text + 0xf;
            uVar37 = chain[0xf];
          }
          else {
            puVar1 = plain_text + uVar38;
            uVar6 = *(uint *)((long)puVar1 + 4);
            uVar3 = puVar1[1];
            uVar7 = *(uint *)((long)puVar1 + 0xc);
            puVar2 = plain_text + uVar38 + 2;
            uVar4 = *puVar2;
            uVar8 = *(uint *)((long)puVar2 + 4);
            uVar18 = puVar2[1];
            uVar9 = *(uint *)((long)puVar2 + 0xc);
            puVar2 = plain_text + uVar38 + 4;
            uVar19 = *puVar2;
            uVar10 = *(uint *)((long)puVar2 + 4);
            uVar20 = puVar2[1];
            uVar11 = *(uint *)((long)puVar2 + 0xc);
            puVar2 = plain_text + uVar38 + 6;
            uVar26 = *puVar2;
            uVar12 = *(uint *)((long)puVar2 + 4);
            uVar27 = puVar2[1];
            uVar13 = *(uint *)((long)puVar2 + 0xc);
            puVar2 = plain_text + uVar38;
            *(uint *)puVar2 = (uint)*puVar1 ^ (uint)uStack_128;
            *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_128._4_4_;
            *(uint *)(puVar2 + 1) = (uint)uVar3 ^ (uint)uStack_120;
            *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_120._4_4_;
            puVar1 = plain_text + uVar38 + 2;
            *(uint *)puVar1 = (uint)uVar4 ^ (uint)uStack_138;
            *(uint *)((long)puVar1 + 4) = uVar8 ^ uStack_138._4_4_;
            *(uint *)(puVar1 + 1) = (uint)uVar18 ^ (uint)uStack_130;
            *(uint *)((long)puVar1 + 0xc) = uVar9 ^ uStack_130._4_4_;
            puVar1 = plain_text + uVar38 + 4;
            *(uint *)puVar1 = (uint)uVar19 ^ (uint)uStack_148;
            *(uint *)((long)puVar1 + 4) = uVar10 ^ uStack_148._4_4_;
            *(uint *)(puVar1 + 1) = (uint)uVar20 ^ (uint)uStack_140;
            *(uint *)((long)puVar1 + 0xc) = uVar11 ^ uStack_140._4_4_;
            puVar1 = plain_text + uVar38 + 6;
            *(uint *)puVar1 = (uint)uVar26 ^ (uint)uStack_158;
            *(uint *)((long)puVar1 + 4) = uVar12 ^ uStack_158._4_4_;
            *(uint *)(puVar1 + 1) = (uint)uVar27 ^ (uint)uStack_150;
            *(uint *)((long)puVar1 + 0xc) = uVar13 ^ uStack_150._4_4_;
            puVar1 = plain_text + uVar38 + 8;
            uVar6 = *(uint *)((long)puVar1 + 4);
            uVar3 = puVar1[1];
            uVar7 = *(uint *)((long)puVar1 + 0xc);
            puVar2 = plain_text + uVar38 + 8;
            *(uint *)puVar2 = (uint)*puVar1 ^ (uint)uStack_168;
            *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_168._4_4_;
            *(uint *)(puVar2 + 1) = (uint)uVar3 ^ (uint)uStack_160;
            *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_160._4_4_;
            puVar1 = plain_text + uVar38 + 10;
            uVar6 = *(uint *)((long)puVar1 + 4);
            uVar3 = puVar1[1];
            uVar7 = *(uint *)((long)puVar1 + 0xc);
            puVar2 = plain_text + uVar38 + 10;
            *(uint *)puVar2 = (uint)*puVar1 ^ (uint)uStack_178;
            *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_178._4_4_;
            *(uint *)(puVar2 + 1) = (uint)uVar3 ^ (uint)uStack_170;
            *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_170._4_4_;
            puVar1 = plain_text + uVar38 + 0xc;
            uVar6 = *(uint *)((long)puVar1 + 4);
            uVar3 = puVar1[1];
            uVar7 = *(uint *)((long)puVar1 + 0xc);
            puVar2 = plain_text + uVar38 + 0xc;
            *(uint *)puVar2 = (uint)*puVar1 ^ (uint)uStack_188;
            *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_188._4_4_;
            *(uint *)(puVar2 + 1) = (uint)uVar3 ^ (uint)uStack_180;
            *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_180._4_4_;
            plain_text[uVar38 + 0xe] = plain_text[uVar38 + 0xe] ^ uStack_1c0;
            uVar37 = uStack_1b8;
          }
        }
        else {
          puVar1 = plain_text + uVar38;
          uVar6 = *(uint *)((long)puVar1 + 4);
          uVar37 = puVar1[1];
          uVar7 = *(uint *)((long)puVar1 + 0xc);
          puVar2 = plain_text + uVar38 + 2;
          uVar28 = *puVar2;
          uVar8 = *(uint *)((long)puVar2 + 4);
          uVar29 = puVar2[1];
          uVar9 = *(uint *)((long)puVar2 + 0xc);
          puVar2 = plain_text + uVar38 + 4;
          uVar30 = *puVar2;
          uVar10 = *(uint *)((long)puVar2 + 4);
          uVar31 = puVar2[1];
          uVar11 = *(uint *)((long)puVar2 + 0xc);
          puVar2 = plain_text + uVar38 + 6;
          uVar32 = *puVar2;
          uVar12 = *(uint *)((long)puVar2 + 4);
          uVar33 = puVar2[1];
          uVar13 = *(uint *)((long)puVar2 + 0xc);
          puVar2 = plain_text + uVar38;
          *(uint *)puVar2 = (uint)*puVar1 ^ (uint)uStack_b8;
          *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_b8._4_4_;
          *(uint *)(puVar2 + 1) = (uint)uVar37 ^ (uint)uStack_b0;
          *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_b0._4_4_;
          puVar1 = plain_text + uVar38 + 2;
          *(uint *)puVar1 = (uint)uVar28 ^ uStack_d8;
          *(uint *)((long)puVar1 + 4) = uVar8 ^ uStack_d4;
          *(uint *)(puVar1 + 1) = (uint)uVar29 ^ uStack_d0;
          *(uint *)((long)puVar1 + 0xc) = uVar9 ^ uStack_cc;
          puVar1 = plain_text + uVar38 + 4;
          *(uint *)puVar1 = (uint)uVar30 ^ (uint)uStack_c8;
          *(uint *)((long)puVar1 + 4) = uVar10 ^ uStack_c8._4_4_;
          *(uint *)(puVar1 + 1) = (uint)uVar31 ^ (uint)uStack_c0;
          *(uint *)((long)puVar1 + 0xc) = uVar11 ^ uStack_c0._4_4_;
          puVar1 = plain_text + uVar38 + 6;
          *(uint *)puVar1 = (uint)uVar32 ^ uStack_e8;
          *(uint *)((long)puVar1 + 4) = uVar12 ^ uStack_e4;
          *(uint *)(puVar1 + 1) = (uint)uVar33 ^ uStack_e0;
          *(uint *)((long)puVar1 + 0xc) = uVar13 ^ uStack_dc;
          puVar1 = plain_text + uVar38 + 8;
          uVar6 = *(uint *)((long)puVar1 + 4);
          uVar37 = puVar1[1];
          uVar7 = *(uint *)((long)puVar1 + 0xc);
          puVar2 = plain_text + uVar38 + 8;
          *(uint *)puVar2 = (uint)*puVar1 ^ (uint)uStack_f8;
          *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_f8._4_4_;
          *(uint *)(puVar2 + 1) = (uint)uVar37 ^ (uint)uStack_f0;
          *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_f0._4_4_;
          puVar1 = plain_text + uVar38 + 10;
          uVar6 = *(uint *)((long)puVar1 + 4);
          uVar37 = puVar1[1];
          uVar7 = *(uint *)((long)puVar1 + 0xc);
          puVar2 = plain_text + uVar38 + 10;
          *(uint *)puVar2 = (uint)*puVar1 ^ uStack_108;
          *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_104;
          *(uint *)(puVar2 + 1) = (uint)uVar37 ^ (uint)uStack_100;
          *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_100._4_4_;
          puVar1 = plain_text + uVar38 + 0xc;
          uVar6 = *(uint *)((long)puVar1 + 4);
          uVar37 = puVar1[1];
          uVar7 = *(uint *)((long)puVar1 + 0xc);
          puVar2 = plain_text + uVar38 + 0xc;
          *(uint *)puVar2 = (uint)*puVar1 ^ uStack_118;
          *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_114;
          *(uint *)(puVar2 + 1) = (uint)uVar37 ^ uStack_110;
          *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_10c;
          plain_text[uVar38 + 0xe] = plain_text[uVar38 + 0xe] ^ uStack_1c8;
          uVar37 = uVar34;
          uStack_1c0 = uVar3;
          uStack_1b8 = uVar4;
          uStack_188 = uVar16;
          uStack_180 = uVar17;
          uStack_178 = uVar25;
          uStack_170 = uVar15;
          uStack_168 = uVar23;
          uStack_160 = uVar24;
          uStack_158 = uVar21;
          uStack_150 = uVar22;
          uStack_148 = uVar27;
          uStack_140 = uVar14;
          uStack_138 = uVar20;
          uStack_130 = uVar26;
          uStack_128 = uVar18;
          uStack_120 = uVar19;
        }
        *puVar35 = *puVar35 ^ uVar37;
        uVar38 = uVar38 + 0x10;
        puVar39 = puVar39 + 0x10;
      } while (uVar38 < num_blocks << 4);
    }
    return;
  }
  if (uVar5 == 0x200) {
    if (num_blocks << 3 != 0) {
      uStack_a8 = 0;
      uStack_a0 = 0;
      uVar38 = 0;
      uVar34 = 0;
      uStack_100 = 0;
      uStack_f0 = 0;
      uStack_f8 = 0;
      uStack_b8 = 0;
      uStack_b0 = 0;
      uStack_c8 = 0;
      uStack_c0 = 0;
      uStack_78 = 0;
      uStack_74 = 0;
      uStack_70 = 0;
      uStack_6c = 0;
      uStack_98 = 0;
      uStack_94 = 0;
      uStack_90 = 0;
      uStack_8c = 0;
      uStack_88 = 0;
      uStack_84 = 0;
      uStack_80 = 0;
      uStack_7c = 0;
      puVar39 = plain_text;
      do {
        uVar18 = plain_text[uVar38];
        uVar19 = (plain_text + uVar38)[1];
        uVar20 = plain_text[uVar38 + 2];
        uVar26 = (plain_text + uVar38 + 2)[1];
        uVar27 = plain_text[uVar38 + 4];
        uVar14 = (plain_text + uVar38 + 4)[1];
        uVar3 = plain_text[uVar38 + 6];
        puVar35 = puVar39 + 7;
        uVar4 = plain_text[uVar38 + 7];
        threefishDecryptBlockWords(key,puVar39,puVar39);
        if ((uVar38 & 8) == 0) {
          uStack_88 = (uint)uVar27;
          uStack_84 = (uint)(uVar27 >> 0x20);
          uStack_80 = (uint)uVar14;
          uStack_7c = (uint)(uVar14 >> 0x20);
          uStack_98 = (uint)uVar20;
          uStack_94 = (uint)(uVar20 >> 0x20);
          uStack_90 = (uint)uVar26;
          uStack_8c = (uint)(uVar26 >> 0x20);
          uStack_78 = (uint)uVar18;
          uStack_74 = (uint)(uVar18 >> 0x20);
          uStack_70 = (uint)uVar19;
          uStack_6c = (uint)(uVar19 >> 0x20);
          uVar34 = uVar4;
          uStack_100 = uVar3;
          if (uVar38 == 0) {
            *plain_text = *plain_text ^ *chain;
            plain_text[1] = plain_text[1] ^ chain[1];
            plain_text[2] = plain_text[2] ^ chain[2];
            plain_text[3] = plain_text[3] ^ chain[3];
            plain_text[4] = plain_text[4] ^ chain[4];
            plain_text[5] = plain_text[5] ^ chain[5];
            plain_text[6] = plain_text[6] ^ chain[6];
            puVar35 = plain_text + 7;
            uVar36 = chain[7];
          }
          else {
            puVar1 = plain_text + uVar38;
            uVar6 = *(uint *)((long)puVar1 + 4);
            uVar3 = puVar1[1];
            uVar7 = *(uint *)((long)puVar1 + 0xc);
            puVar2 = plain_text + uVar38 + 2;
            uVar4 = *puVar2;
            uVar8 = *(uint *)((long)puVar2 + 4);
            uVar18 = puVar2[1];
            uVar9 = *(uint *)((long)puVar2 + 0xc);
            puVar2 = plain_text + uVar38 + 4;
            uVar19 = *puVar2;
            uVar10 = *(uint *)((long)puVar2 + 4);
            uVar20 = puVar2[1];
            uVar11 = *(uint *)((long)puVar2 + 0xc);
            puVar2 = plain_text + uVar38;
            *(uint *)puVar2 = (uint)*puVar1 ^ (uint)uStack_a8;
            *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_a8._4_4_;
            *(uint *)(puVar2 + 1) = (uint)uVar3 ^ (uint)uStack_a0;
            *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_a0._4_4_;
            puVar1 = plain_text + uVar38 + 2;
            *(uint *)puVar1 = (uint)uVar4 ^ (uint)uStack_b8;
            *(uint *)((long)puVar1 + 4) = uVar8 ^ uStack_b8._4_4_;
            *(uint *)(puVar1 + 1) = (uint)uVar18 ^ (uint)uStack_b0;
            *(uint *)((long)puVar1 + 0xc) = uVar9 ^ uStack_b0._4_4_;
            puVar1 = plain_text + uVar38 + 4;
            *(uint *)puVar1 = (uint)uVar19 ^ (uint)uStack_c8;
            *(uint *)((long)puVar1 + 4) = uVar10 ^ uStack_c8._4_4_;
            *(uint *)(puVar1 + 1) = (uint)uVar20 ^ (uint)uStack_c0;
            *(uint *)((long)puVar1 + 0xc) = uVar11 ^ uStack_c0._4_4_;
            plain_text[uVar38 + 6] = plain_text[uVar38 + 6] ^ uStack_f8;
            uVar36 = uStack_f0;
          }
        }
        else {
          puVar1 = plain_text + uVar38;
          uVar6 = *(uint *)((long)puVar1 + 4);
          uVar21 = puVar1[1];
          uVar7 = *(uint *)((long)puVar1 + 0xc);
          puVar2 = plain_text + uVar38 + 2;
          uVar22 = *puVar2;
          uVar8 = *(uint *)((long)puVar2 + 4);
          uVar23 = puVar2[1];
          uVar9 = *(uint *)((long)puVar2 + 0xc);
          puVar2 = plain_text + uVar38 + 4;
          uVar24 = *puVar2;
          uVar10 = *(uint *)((long)puVar2 + 4);
          uVar25 = puVar2[1];
          uVar11 = *(uint *)((long)puVar2 + 0xc);
          puVar2 = plain_text + uVar38;
          *(uint *)puVar2 = (uint)*puVar1 ^ uStack_78;
          *(uint *)((long)puVar2 + 4) = uVar6 ^ uStack_74;
          *(uint *)(puVar2 + 1) = (uint)uVar21 ^ uStack_70;
          *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uStack_6c;
          puVar1 = plain_text + uVar38 + 2;
          *(uint *)puVar1 = (uint)uVar22 ^ uStack_98;
          *(uint *)((long)puVar1 + 4) = uVar8 ^ uStack_94;
          *(uint *)(puVar1 + 1) = (uint)uVar23 ^ uStack_90;
          *(uint *)((long)puVar1 + 0xc) = uVar9 ^ uStack_8c;
          puVar1 = plain_text + uVar38 + 4;
          *(uint *)puVar1 = (uint)uVar24 ^ uStack_88;
          *(uint *)((long)puVar1 + 4) = uVar10 ^ uStack_84;
          *(uint *)(puVar1 + 1) = (uint)uVar25 ^ uStack_80;
          *(uint *)((long)puVar1 + 0xc) = uVar11 ^ uStack_7c;
          plain_text[uVar38 + 6] = plain_text[uVar38 + 6] ^ uStack_100;
          uVar36 = uVar34;
          uStack_f8 = uVar3;
          uStack_f0 = uVar4;
          uStack_c8 = uVar27;
          uStack_c0 = uVar14;
          uStack_b8 = uVar20;
          uStack_b0 = uVar26;
          uStack_a8 = uVar18;
          uStack_a0 = uVar19;
        }
        *puVar35 = *puVar35 ^ uVar36;
        uVar38 = uVar38 + 8;
        puVar39 = puVar39 + 8;
      } while (uVar38 < num_blocks << 3);
    }
    return;
  }
  if (uVar5 != 0x100) {
    decryptInPlace_cold_1();
    *extraout_RDX = *extraout_RDX ^ *chain;
    extraout_RDX[1] = extraout_RDX[1] ^ chain[1];
    extraout_RDX[2] = extraout_RDX[2] ^ chain[2];
    extraout_RDX[3] = extraout_RDX[3] ^ chain[3];
    if (num_blocks << 2 != 0) {
      uVar38 = 0;
      puVar35 = extraout_RDX;
      do {
        if (uVar38 != 0) {
          *(uint *)puVar35 = (uint)*puVar35 ^ (uint)puVar35[-4];
          *(uint *)((long)puVar35 + 4) =
               *(uint *)((long)puVar35 + 4) ^ *(uint *)((long)puVar35 + -0x1c);
          *(uint *)(puVar35 + 1) = (uint)puVar35[1] ^ (uint)puVar35[-3];
          *(uint *)((long)puVar35 + 0xc) =
               *(uint *)((long)puVar35 + 0xc) ^ *(uint *)((long)puVar35 + -0x14);
          *(uint *)(puVar35 + 2) = (uint)puVar35[2] ^ (uint)puVar35[-2];
          *(uint *)((long)puVar35 + 0x14) =
               *(uint *)((long)puVar35 + 0x14) ^ *(uint *)((long)puVar35 + -0xc);
          *(uint *)(puVar35 + 3) = (uint)puVar35[3] ^ (uint)puVar35[-1];
          *(uint *)((long)puVar35 + 0x1c) =
               *(uint *)((long)puVar35 + 0x1c) ^ *(uint *)((long)puVar35 + -4);
        }
        threefishEncryptBlockWords(key,puVar35,puVar35);
        uVar38 = uVar38 + 4;
        puVar35 = puVar35 + 4;
      } while (uVar38 < num_blocks << 2);
    }
    return;
  }
  cbc256Decrypt(key,chain,plain_text,num_blocks);
  return;
}

Assistant:

void decryptInPlace(ThreefishKey_t* key,
                    const uint64_t* chain,
                    uint64_t* plain_text,
                    const uint64_t num_blocks)
{
    pd2("decryptInPlace(key:%lu, chain:%lu, plain_text:%lu, num_blocks:%lu)\n",
        key->key[0],
        chain[0],
        plain_text[0],
        num_blocks);

    switch(key->stateSize) //call the corresponding cbc Encrypt function
    {
        case 256: cbc256Decrypt(key, chain, plain_text, num_blocks);
        break;
        case 512: cbc512Decrypt(key, chain, plain_text, num_blocks);
        break;
        case 1024: cbc1024Decrypt(key, chain, plain_text, num_blocks);
        break;
        default:
        {
            perror("Invalid state size cannot continue\n");
            exit(9);
        }
        break;
    }
}